

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_tpf(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  ushort uVar1;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  uVar1 = insn & 7;
  if (uVar1 == 2) {
    s->pc = s->pc + 2;
  }
  else if (uVar1 == 3) {
    s->pc = s->pc + 4;
  }
  else if (uVar1 != 4) {
    disas_undef(env,s,insn);
  }
  return;
}

Assistant:

DISAS_INSN(tpf)
{
    switch (insn & 7) {
    case 2: /* One extension word.  */
        s->pc += 2;
        break;
    case 3: /* Two extension words.  */
        s->pc += 4;
        break;
    case 4: /* No extension words.  */
        break;
    default:
        disas_undef(env, s, insn);
    }
}